

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeinfo.c
# Opt level: O2

void prf_nodeinfo_exit(void)

{
  prf_nodeinfo_t **id;
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = prf_array_count(nodetypes);
  id = nodetypes;
  uVar3 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    if (id[uVar3] != (prf_nodeinfo_t *)0x0) {
      free(id[uVar3]->name);
      free(id[uVar3]);
    }
  }
  prf_array_free(id);
  nodetypes = (prf_nodeinfo_t **)0x0;
  return;
}

Assistant:

void
prf_nodeinfo_exit(
    void )
{
    int i, count;
    count = prf_array_count(nodetypes);
    for ( i = 0; i < count; i++ ) {
        if ( nodetypes[i] != NULL ) {
            free(nodetypes[i]->name);
            free(nodetypes[i]);
        }
    }
    prf_array_free(nodetypes);
    nodetypes = NULL;
}